

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O2

string * __thiscall
cali::Variant::to_string_abi_cxx11_(string *__return_storage_ptr__,Variant *this)

{
  cali_attr_type type;
  size_t sVar1;
  uchar *__last;
  void *pvVar2;
  string local_1c0 [32];
  ostringstream os;
  undefined8 uStack_190;
  uint auStack_188 [88];
  ostream *local_28;
  char *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((char)(this->m_v).type_and_size) {
  case '\x01':
    sVar1 = size(this);
    __last = (uchar *)cali_variant_get_data(&this->m_v);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&uStack_190 + *(long *)(_os + -0x18)) = 2;
    local_28 = std::operator<<(&os,0x30);
    local_20 = ":";
    std::copy<unsigned_char_const*,std::ostream_iterator<unsigned_int,char,std::char_traits<char>>>
              ((uchar *)local_1c0,__last,
               (ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> *)(__last + sVar1));
    std::__cxx11::stringbuf::str();
    goto LAB_001bf346;
  case '\x02':
    std::__cxx11::to_string((string *)&os,(this->m_v).value.v_int);
    goto LAB_001bf2bc;
  case '\x03':
    std::__cxx11::to_string((string *)&os,(this->m_v).value.v_uint);
    goto LAB_001bf2bc;
  case '\x04':
    pvVar2 = cali_variant_get_data(&this->m_v);
    size(this);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pvVar2);
    break;
  case '\x05':
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
    to_uint(this,(bool *)0x0);
    std::ostream::_M_insert<unsigned_long>((ulong)&os);
    std::__cxx11::stringbuf::str();
    goto LAB_001bf346;
  case '\x06':
    std::__cxx11::to_string((string *)&os,(this->m_v).value.v_double);
LAB_001bf2bc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&os);
    std::__cxx11::string::~string((string *)&os);
    break;
  case '\a':
    to_bool(this,(bool *)0x0);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case '\b':
    type = to_attr_type(this,(bool *)0x0);
    cali_type2string(type);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case '\t':
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
    cali_variant_get_data(&this->m_v);
    std::ostream::_M_insert<unsigned_long>((ulong)&os);
    std::__cxx11::stringbuf::str();
LAB_001bf346:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variant::to_string() const
{
    std::string ret;

    switch (this->type()) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_USR:
        {
            size_t      size = this->size();
            const void* ptr  = data();

            std::ostringstream os;

            std::copy(
                static_cast<const unsigned char*>(ptr),
                static_cast<const unsigned char*>(ptr) + size,
                std::ostream_iterator<unsigned>(os << std::hex << std::setw(2) << std::setfill('0'), ":")
            );

            ret = os.str();
        }
        break;
    case CALI_TYPE_INT:
        ret = std::to_string(m_v.value.v_int);
        break;
    case CALI_TYPE_UINT:
        ret = std::to_string(m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        {
            const char* str = static_cast<const char*>(data());
            std::size_t len = size();

            if (len && str[len - 1] == 0)
                --len;

            ret.assign(str, len);
        }
        break;
    case CALI_TYPE_ADDR:
        {
            std::ostringstream os;
            os << std::hex << to_uint();
            ret = os.str();
        }
        break;
    case CALI_TYPE_DOUBLE:
        ret = std::to_string(m_v.value.v_double);
        break;
    case CALI_TYPE_BOOL:
        ret = to_bool() ? "true" : "false";
        break;
    case CALI_TYPE_TYPE:
        ret = cali_type2string(to_attr_type());
        break;
    case CALI_TYPE_PTR:
        {
            std::ostringstream os;
            os << std::hex << reinterpret_cast<uint64_t>(data());
            ret = os.str();
        }
    }

    return ret;
}